

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O0

int __thiscall GPIO::Tools::AutoFile::close(AutoFile *this,int __fd)

{
  int iVar1;
  string *psVar2;
  int *piVar3;
  ToolsError *this_00;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  if (-1 < this->m_fd) {
    iVar1 = ::close(this->m_fd);
    if (iVar1 < 0) {
      psVar2 = (string *)__cxa_allocate_exception(0x10);
      this_00 = (ToolsError *)&stack0xffffffffffffffb7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      piVar3 = __errno_location();
      strerror(*piVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)this_00);
      ToolsError::runtime_error(this_00,psVar2);
      __cxa_throw(psVar2,&ToolsError::typeinfo,ToolsError::~ToolsError);
    }
    *(int *)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this)->
             _M_dataplus)._M_p = -1;
  }
  return (int)this;
}

Assistant:

void AutoFile::close()
{
    if (m_fd < 0) return;
    if (::close(m_fd) < 0) throw ToolsError(std::string("cannot close file: ") + std::strerror(errno));
    m_fd = -1;
}